

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitArrayNewSeg(FunctionValidator *this,ArrayNewSeg *curr)

{
  bool bVar1;
  Module *pMVar2;
  DataSegment *pDVar3;
  ElementSegment *pEVar4;
  HeapType local_80 [2];
  Type local_70;
  Type elemType;
  HeapType heapType;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  ArrayNewSeg *local_18;
  ArrayNewSeg *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ArrayNewSeg *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::ArrayNewSeg*>
            (this,bVar1,local_18,"array.new_{data, elem} requires gc [--enable-gc]");
  local_20.id = (local_18->offset->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewSeg*,wasm::Type>
            (this,local_20,local_28,local_18,"array.new_{data, elem} offset must be an i32");
  local_30.id = (local_18->size->type).id;
  wasm::Type::Type(&local_38,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewSeg*,wasm::Type>
            (this,local_30,local_38,local_18,"array.new_{data, elem} size must be an i32");
  if (local_18->op == NewData) {
    pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    pDVar3 = Module::getDataSegment(pMVar2,(Name)(local_18->segment).super_IString.str);
    bVar1 = shouldBeTrue<wasm::ArrayNewSeg*>
                      (this,pDVar3 != (DataSegment *)0x0,local_18,
                       "array.new_data segment should exist");
  }
  else {
    if (local_18->op != NewElem) {
      handle_unreachable("unexpected op",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                         ,0xab0);
    }
    pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    pEVar4 = Module::getElementSegment(pMVar2,(Name)(local_18->segment).super_IString.str);
    bVar1 = shouldBeTrue<wasm::ArrayNewSeg*>
                      (this,pEVar4 != (ElementSegment *)0x0,local_18,
                       "array.new_elem segment should exist");
  }
  if (bVar1) {
    heapType.id._4_4_ = 1;
    bVar1 = wasm::Type::operator==
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)64>).
                        super_Expression.type,(BasicType *)((long)&heapType.id + 4));
    if (!bVar1) {
      bVar1 = wasm::Type::isRef(&(local_18->super_SpecificExpression<(wasm::Expression::Id)64>).
                                 super_Expression.type);
      bVar1 = shouldBeTrue<wasm::ArrayNewSeg*>
                        (this,bVar1,local_18,
                         "array.new_{data, elem} type should be an array reference");
      if (bVar1) {
        elemType.id = (uintptr_t)
                      wasm::Type::getHeapType
                                (&(local_18->super_SpecificExpression<(wasm::Expression::Id)64>).
                                  super_Expression.type);
        bVar1 = HeapType::isArray((HeapType *)&elemType);
        bVar1 = shouldBeTrue<wasm::ArrayNewSeg*>
                          (this,bVar1,local_18,
                           "array.new_{data, elem} type shoudl be an array reference");
        if (bVar1) {
          HeapType::getArray(local_80);
          local_70.id = local_80[0].id;
          if (local_18->op == NewData) {
            bVar1 = wasm::Type::isNumber(&local_70);
            shouldBeTrue<wasm::ArrayNewSeg*>
                      (this,bVar1,local_18,"array.new_data result element type should be numeric");
          }
          else {
            if (local_18->op != NewElem) {
              handle_unreachable("unexpected op",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                                 ,0xad1);
            }
            pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     ::getModule(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                );
            pEVar4 = Module::getElementSegment(pMVar2,(Name)(local_18->segment).super_IString.str);
            shouldBeSubType(this,(Type)(pEVar4->type).id,local_70,(Expression *)local_18,
                            "array.new_elem segment type should be a subtype of the result element type"
                           );
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNewSeg(ArrayNewSeg* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.new_{data, elem} requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->offset->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} offset must be an i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} size must be an i32");
  switch (curr->op) {
    case NewData:
      if (!shouldBeTrue(getModule()->getDataSegment(curr->segment),
                        curr,
                        "array.new_data segment should exist")) {
        return;
      }
      break;
    case NewElem:
      if (!shouldBeTrue(getModule()->getElementSegment(curr->segment),
                        curr,
                        "array.new_elem segment should exist")) {
        return;
      }
      break;
    default:
      WASM_UNREACHABLE("unexpected op");
  }
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(
        curr->type.isRef(),
        curr,
        "array.new_{data, elem} type should be an array reference")) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(),
        curr,
        "array.new_{data, elem} type shoudl be an array reference")) {
    return;
  }
  auto elemType = heapType.getArray().element.type;
  switch (curr->op) {
    case NewData:
      shouldBeTrue(elemType.isNumber(),
                   curr,
                   "array.new_data result element type should be numeric");
      break;
    case NewElem:
      shouldBeSubType(getModule()->getElementSegment(curr->segment)->type,
                      elemType,
                      curr,
                      "array.new_elem segment type should be a subtype of the "
                      "result element type");
      break;
    default:
      WASM_UNREACHABLE("unexpected op");
  }
}